

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::HostFunc::DoCall
          (HostFunc *this,Thread *thread,Values *params,Values *results,Ptr *out_trap)

{
  Result RVar1;
  Ptr *out_trap_local;
  Values *results_local;
  Values *params_local;
  Thread *thread_local;
  HostFunc *this_local;
  
  RVar1 = std::
          function<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
          ::operator()(&this->callback_,params,results,out_trap);
  return (Result)RVar1.enum_;
}

Assistant:

Result HostFunc::DoCall(Thread& thread,
                        const Values& params,
                        Values& results,
                        Trap::Ptr* out_trap) {
  return callback_(params, results, out_trap);
}